

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O3

void __thiscall fasttext::Autotune::startTimer(Autotune *this,Args *args)

{
  __sighandler_t p_Var1;
  __sighandler_t previousSignalHandler;
  thread local_1d8;
  __sighandler_t local_1d0;
  Autotune *local_1c8;
  long lStack_1c0;
  Args local_1b8;
  
  lStack_1c0 = std::chrono::_V2::steady_clock::now();
  local_1c8 = this;
  Args::Args(&local_1b8,args);
  local_1d8._M_id._M_thread = (id)0;
  p_Var1 = (__sighandler_t)operator_new(0x1a8);
  *(undefined ***)p_Var1 = &PTR___State_impl_001504b0;
  *(Autotune **)(p_Var1 + 8) = local_1c8;
  *(long *)(p_Var1 + 0x10) = lStack_1c0;
  Args::Args((Args *)(p_Var1 + 0x18),&local_1b8);
  local_1d0 = p_Var1;
  std::thread::_M_start_thread(&local_1d8,&local_1d0,0);
  if (local_1d0 != (__sighandler_t)0x0) {
    (**(code **)(*(long *)local_1d0 + 8))();
  }
  if ((this->timer_)._M_id._M_thread == 0) {
    (this->timer_)._M_id._M_thread = (native_handle_type)local_1d8._M_id._M_thread;
    local_1d8._M_id._M_thread = (id)0;
    Args::~Args(&local_1b8);
    this->bestScore_ = -1.0;
    this->trials_ = 0;
    LOCK();
    (this->continueTraining_)._M_base._M_i = true;
    UNLOCK();
    local_1d0 = signal(2,anon_unknown.dwarf_21639::signalHandler);
    local_1b8.manualArgs_._M_h._M_bucket_count =
         (anonymous_namespace)::interruptSignalHandler._24_8_;
    local_1b8.manualArgs_._M_h._M_buckets =
         (__buckets_ptr)(anonymous_namespace)::interruptSignalHandler._16_8_;
    (anonymous_namespace)::interruptSignalHandler._16_8_ =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/autotune.cc:270:28)>
         ::_M_manager;
    (anonymous_namespace)::interruptSignalHandler._24_8_ =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/autotune.cc:270:28)>
         ::_M_invoke;
    local_1c8 = (Autotune *)(anonymous_namespace)::interruptSignalHandler._0_8_;
    lStack_1c0 = (anonymous_namespace)::interruptSignalHandler._8_8_;
    (anonymous_namespace)::interruptSignalHandler._0_8_ = &local_1d0;
    (anonymous_namespace)::interruptSignalHandler._8_8_ = this;
    if (local_1b8.manualArgs_._M_h._M_buckets != (__buckets_ptr)0x0) {
      (*(code *)local_1b8.manualArgs_._M_h._M_buckets)(&local_1c8,&local_1c8,3);
    }
    return;
  }
  std::terminate();
}

Assistant:

void Autotune::startTimer(const Args& args) {
  std::chrono::steady_clock::time_point start =
      std::chrono::steady_clock::now();
  timer_ = std::thread([=]() { timer(start, args.autotuneDuration); });
  bestScore_ = kUnknownBestScore;
  trials_ = 0;
  continueTraining_ = true;

  auto previousSignalHandler = std::signal(SIGINT, signalHandler);
  interruptSignalHandler = [&]() {
    std::signal(SIGINT, previousSignalHandler);
    std::cerr << std::endl << "Aborting autotune..." << std::endl;
    abort();
  };
}